

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

bool Guest_WaitForOthers(void *userdata)

{
  int iVar1;
  int local_68;
  char local_64;
  undefined1 local_63;
  byte local_62;
  byte local_61;
  int node;
  PreGamePacket packet;
  sockaddr_in *from;
  void *userdata_local;
  
  while (packet.machines[7] = (anon_struct_8_4_8d968fe9)PreGet(&local_64,0x44,false),
        packet.machines[7] != (anon_struct_8_4_8d968fe9)0x0) {
    if ((local_64 == '0') && (iVar1 = FindNode((sockaddr_in *)packet.machines[7]), iVar1 == 1)) {
      switch(local_63) {
      case 2:
        I_FatalError("The host cancelled the game.");
        break;
      case 3:
        if (doomcom.numnodes == 2) {
          doomcom.numnodes = local_62 + 2;
          sendplayer[0] = local_61;
          doomcom.consoleplayer = (SWORD)local_61;
          (*StartScreen->_vptr_FStartupScreen[7])
                    (StartScreen,"Console player number: %d",(ulong)(uint)(int)doomcom.consoleplayer
                    );
          for (local_68 = 0; local_68 < (int)(uint)local_62; local_68 = local_68 + 1) {
            sendaddress[local_68 + 2].sin_addr.s_addr = packet.machines[(long)local_68 + -1].address
            ;
            sendaddress[local_68 + 2].sin_port = packet.machines[(long)local_68 + -1].port;
            sendplayer[local_68 + 2] = packet.machines[(long)local_68 + -1].player;
            sendaddress[local_68 + 2].sin_family = 2;
          }
        }
        (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received All Here, sending ACK.");
        local_64 = '0';
        local_63 = 6;
        PreSend(&local_64,2,sendaddress + 1);
        break;
      case 4:
        (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)local_61);
        break;
      case 7:
        (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received \"Go.\"");
        return true;
      }
    }
  }
  local_64 = '0';
  local_63 = 1;
  PreSend(&local_64,2,sendaddress + 1);
  return false;
}

Assistant:

bool Guest_WaitForOthers (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE || FindNode(from) != 1)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONACK:
			StartScreen->NetProgress (packet.NumPresent);
			break;

		case PRE_ALLHERE:
			if (doomcom.numnodes == 2)
			{
				int node;

				doomcom.numnodes = packet.NumNodes + 2;
				sendplayer[0] = packet.ConsoleNum;	// My player number
				doomcom.consoleplayer = packet.ConsoleNum;
				StartScreen->NetMessage ("Console player number: %d", doomcom.consoleplayer);
				for (node = 0; node < packet.NumNodes; node++)
				{
					sendaddress[node+2].sin_addr.s_addr = packet.machines[node].address;
					sendaddress[node+2].sin_port = packet.machines[node].port;
					sendplayer[node+2] = packet.machines[node].player;

					// [JC] - fixes problem of games not starting due to
					// no address family being assigned to nodes stored in
					// sendaddress[] from the All Here packet.
					sendaddress[node+2].sin_family = AF_INET;
				}
			}

			StartScreen->NetMessage ("Received All Here, sending ACK.");
			packet.Fake = PRE_FAKE;
			packet.Message = PRE_ALLHEREACK;
			PreSend (&packet, 2, &sendaddress[1]);
			break;

		case PRE_GO:
			StartScreen->NetMessage ("Received \"Go.\"");
			return true;

		case PRE_DISCONNECT:
			I_FatalError ("The host cancelled the game.");
			break;
		}
	}

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_KEEPALIVE;
	PreSend(&packet, 2, &sendaddress[1]);

	return false;
}